

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O1

void __thiscall
filtered_directed_graph_t::filtered_directed_graph_t
          (filtered_directed_graph_t *this,vector<float,_std::allocator<float>_> *_vertex_filtration
          ,bool directed)

{
  length_error *this_00;
  
  directed_graph_t::directed_graph_t
            (&this->super_directed_graph_t,
             (vertex_index_t)
             ((uint)(*(int *)&(_vertex_filtration->super__Vector_base<float,_std::allocator<float>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(_vertex_filtration->super__Vector_base<float,_std::allocator<float>_>)
                             ._M_impl.super__Vector_impl_data._M_start) >> 2),directed,0.01);
  std::vector<float,_std::allocator<float>_>::vector(&this->vertex_filtration,_vertex_filtration);
  (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ulong)((long)(_vertex_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(_vertex_filtration->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x3fffd) {
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_00,"Too many vertices. Consider compiling flagser with MANY_VERTICES enabled.");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

filtered_directed_graph_t(const std::vector<value_t> _vertex_filtration, bool directed)
	    : directed_graph_t(vertex_index_t(_vertex_filtration.size()), directed), vertex_filtration(_vertex_filtration) {
		if (_vertex_filtration.size() > size_t(std::numeric_limits<vertex_index_t>::max()))
			throw std::length_error("Too many vertices. Consider compiling flagser with MANY_VERTICES enabled.");
	}